

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigInter.c
# Opt level: O1

void Aig_ManInterFast(Aig_Man_t *pManOn,Aig_Man_t *pManOff,int fVerbose)

{
  Aig_Man_t *pAVar1;
  int iVar2;
  Cnf_Dat_t *pCVar3;
  Cnf_Dat_t *pCVar4;
  sat_solver *s;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  int Lits [3];
  int local_6c;
  int local_68;
  lit local_64;
  Cnf_Dat_t *local_60;
  Aig_Man_t *local_58;
  Cnf_Dat_t *local_50;
  Aig_Man_t *local_48;
  void *local_40;
  void *local_38;
  
  if (pManOn->nObjs[2] != pManOff->nObjs[2]) {
    __assert_fail("Aig_ManCiNum(pManOn) == Aig_ManCiNum(pManOff)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigInter.c"
                  ,0x3b,"void Aig_ManInterFast(Aig_Man_t *, Aig_Man_t *, int)");
  }
  iVar2 = pManOn->nObjs[3];
  if (iVar2 != pManOff->nObjs[3]) {
    __assert_fail("Aig_ManCoNum(pManOn) == Aig_ManCoNum(pManOff)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigInter.c"
                  ,0x3c,"void Aig_ManInterFast(Aig_Man_t *, Aig_Man_t *, int)");
  }
  pManOn->nRegs = iVar2;
  pCVar3 = Cnf_Derive(pManOn,iVar2);
  pManOn->nRegs = 0;
  pManOff->nRegs = pManOn->nObjs[3];
  pCVar4 = Cnf_Derive(pManOff,pManOff->nObjs[3]);
  pManOff->nRegs = 0;
  Cnf_DataLift(pCVar4,pCVar3->nVars);
  s = sat_solver_new();
  local_60 = pCVar4;
  sat_solver_setnvars(s,pCVar4->nVars + pCVar3->nVars);
  lVar6 = 0;
  do {
    if (pCVar3->nClauses <= lVar6) {
      lVar6 = 0;
      goto LAB_006b5ab6;
    }
    iVar2 = sat_solver_addclause(s,pCVar3->pClauses[lVar6],pCVar3->pClauses[lVar6 + 1]);
    lVar6 = lVar6 + 1;
  } while (iVar2 != 0);
  goto LAB_006b5cb4;
  while( true ) {
    iVar2 = sat_solver_addclause(s,local_60->pClauses[lVar6],local_60->pClauses[lVar6 + 1]);
    lVar6 = lVar6 + 1;
    if (iVar2 == 0) break;
LAB_006b5ab6:
    if (local_60->nClauses <= lVar6) {
      pVVar5 = pManOn->vCis;
      local_58 = pManOn;
      if (pVVar5->nSize < 1) goto LAB_006b5bfd;
      lVar6 = 0;
      local_50 = pCVar3;
      local_48 = pManOff;
      goto LAB_006b5b13;
    }
  }
  goto LAB_006b5cb4;
  while( true ) {
    local_40 = pVVar5->pArray[lVar6];
    local_38 = local_48->vCis->pArray[lVar6];
    local_6c = local_50->pVarNums[*(int *)((long)local_40 + 0x24)] * 2;
    local_68 = local_60->pVarNums[*(int *)((long)local_38 + 0x24)] * 2 + 1;
    iVar2 = sat_solver_addclause(s,&local_6c,&local_64);
    if (iVar2 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigInter.c"
                    ,0x70,"void Aig_ManInterFast(Aig_Man_t *, Aig_Man_t *, int)");
    }
    local_6c = pCVar4->pVarNums[*(int *)((long)local_40 + 0x24)] * 2 + 1;
    local_68 = pCVar3->pVarNums[*(int *)((long)local_38 + 0x24)] * 2;
    iVar2 = sat_solver_addclause(s,&local_6c,&local_64);
    if (iVar2 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigInter.c"
                    ,0x74,"void Aig_ManInterFast(Aig_Man_t *, Aig_Man_t *, int)");
    }
    lVar6 = lVar6 + 1;
    pVVar5 = local_58->vCis;
    pCVar3 = local_50;
    pManOff = local_48;
    if (pVVar5->nSize <= lVar6) break;
LAB_006b5b13:
    pCVar4 = local_50;
    pCVar3 = local_60;
    if (local_48->vCis->nSize <= lVar6) goto LAB_006b5cdd;
  }
LAB_006b5bfd:
  iVar2 = sat_solver_simplify(s);
  pAVar1 = local_58;
  if (iVar2 == 0) {
    __assert_fail("status != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigInter.c"
                  ,0x77,"void Aig_ManInterFast(Aig_Man_t *, Aig_Man_t *, int)");
  }
  pVVar5 = local_58->vCos;
  if (0 < pVVar5->nSize) {
    lVar6 = 0;
    do {
      if (pManOff->vCos->nSize <= lVar6) {
LAB_006b5cdd:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      local_6c = pCVar3->pVarNums[*(int *)((long)pVVar5->pArray[lVar6] + 0x24)] * 2;
      local_68 = local_60->pVarNums[*(int *)((long)pManOff->vCos->pArray[lVar6] + 0x24)] * 2;
      iVar2 = sat_solver_solve(s,&local_6c,&local_64,0,0,0,0);
      if (iVar2 != -1) {
        puts("The incremental SAT problem is not UNSAT.");
      }
      lVar6 = lVar6 + 1;
      pVVar5 = pAVar1->vCos;
    } while (lVar6 < pVVar5->nSize);
  }
LAB_006b5cb4:
  Cnf_DataFree(pCVar3);
  Cnf_DataFree(local_60);
  sat_solver_delete(s);
  return;
}

Assistant:

void Aig_ManInterFast( Aig_Man_t * pManOn, Aig_Man_t * pManOff, int fVerbose )
{
    sat_solver * pSat;
    Cnf_Dat_t * pCnfOn, * pCnfOff;
    Aig_Obj_t * pObj, * pObj2;
    int Lits[3], status, i;
//    abctime clk = Abc_Clock();

    assert( Aig_ManCiNum(pManOn) == Aig_ManCiNum(pManOff) );
    assert( Aig_ManCoNum(pManOn) == Aig_ManCoNum(pManOff) );

    // derive CNFs
    pManOn->nRegs = Aig_ManCoNum(pManOn);
    pCnfOn  = Cnf_Derive( pManOn, Aig_ManCoNum(pManOn) );
    pManOn->nRegs = 0;

    pManOff->nRegs = Aig_ManCoNum(pManOn);
    pCnfOff = Cnf_Derive( pManOff, Aig_ManCoNum(pManOff) );
    pManOff->nRegs = 0;

//    pCnfOn  = Cnf_DeriveSimple( pManOn, Aig_ManCoNum(pManOn) );
//    pCnfOff = Cnf_DeriveSimple( pManOff, Aig_ManCoNum(pManOn) );
    Cnf_DataLift( pCnfOff, pCnfOn->nVars );

    // start the solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, pCnfOn->nVars + pCnfOff->nVars );

    // add clauses of A
    for ( i = 0; i < pCnfOn->nClauses; i++ )
    {
        if ( !sat_solver_addclause( pSat, pCnfOn->pClauses[i], pCnfOn->pClauses[i+1] ) )
        {
            Cnf_DataFree( pCnfOn );
            Cnf_DataFree( pCnfOff );
            sat_solver_delete( pSat );
            return;
        }
    }

    // add clauses of B
    for ( i = 0; i < pCnfOff->nClauses; i++ )
    {
        if ( !sat_solver_addclause( pSat, pCnfOff->pClauses[i], pCnfOff->pClauses[i+1] ) )
        {
            Cnf_DataFree( pCnfOn );
            Cnf_DataFree( pCnfOff );
            sat_solver_delete( pSat );
            return;
        }
    }

    // add PI clauses
    // collect the common variables
    Aig_ManForEachCi( pManOn, pObj, i )
    {
        pObj2 = Aig_ManCi( pManOff, i );

        Lits[0] = toLitCond( pCnfOn->pVarNums[pObj->Id], 0 );
        Lits[1] = toLitCond( pCnfOff->pVarNums[pObj2->Id], 1 );
        if ( !sat_solver_addclause( pSat, Lits, Lits+2 ) )
            assert( 0 );
        Lits[0] = toLitCond( pCnfOn->pVarNums[pObj->Id], 1 );
        Lits[1] = toLitCond( pCnfOff->pVarNums[pObj2->Id], 0 );
        if ( !sat_solver_addclause( pSat, Lits, Lits+2 ) )
            assert( 0 );
    }
    status = sat_solver_simplify( pSat );
    assert( status != 0 );

    // solve incremental SAT problems
    Aig_ManForEachCo( pManOn, pObj, i )
    {
        pObj2 = Aig_ManCo( pManOff, i );

        Lits[0] = toLitCond( pCnfOn->pVarNums[pObj->Id], 0 );
        Lits[1] = toLitCond( pCnfOff->pVarNums[pObj2->Id], 0 );
        status = sat_solver_solve( pSat, Lits, Lits+2, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( status != l_False )
            printf( "The incremental SAT problem is not UNSAT.\n" );
    }
    Cnf_DataFree( pCnfOn );
    Cnf_DataFree( pCnfOff );
    sat_solver_delete( pSat );
//    ABC_PRT( "Fast interpolation time", Abc_Clock() - clk );
}